

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

fxp_xfer * xfer_upload_init(fxp_handle *fh,uint64_t offset)

{
  fxp_xfer *pfVar1;
  fxp_xfer *xfer;
  uint64_t offset_local;
  fxp_handle *fh_local;
  
  pfVar1 = xfer_init(fh,offset);
  pfVar1->eof = true;
  return pfVar1;
}

Assistant:

struct fxp_xfer *xfer_upload_init(struct fxp_handle *fh, uint64_t offset)
{
    struct fxp_xfer *xfer = xfer_init(fh, offset);

    /*
     * We set `eof' to 1 because this will cause xfer_done() to
     * return true iff there are no outstanding requests. During an
     * upload, our caller will be responsible for working out
     * whether all the data has been sent, so all it needs to know
     * from us is whether the outstanding requests have been
     * handled once that's done.
     */
    xfer->eof = true;

    return xfer;
}